

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

void __thiscall
QXmlStreamWriter::writeAttribute
          (QXmlStreamWriter *this,QAnyStringView namespaceUri,QAnyStringView name,
          QAnyStringView value)

{
  _Head_base<0UL,_QXmlStreamWriterPrivate_*,_false> this_00;
  ulong uVar1;
  QString *pQVar2;
  NamespaceDeclaration *pNVar3;
  char16_t *__n;
  size_t __n_00;
  void *__buf;
  int __fd;
  
  this_00._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QXmlStreamWriterPrivate,_std::default_delete<QXmlStreamWriterPrivate>_>
       ._M_t.
       super__Tuple_impl<0UL,_QXmlStreamWriterPrivate_*,_std::default_delete<QXmlStreamWriterPrivate>_>
       .super__Head_base<0UL,_QXmlStreamWriterPrivate_*,_false>._M_head_impl;
  __n = (char16_t *)0x1;
  pNVar3 = QXmlStreamWriterPrivate::findNamespace(this_00._M_head_impl,namespaceUri,true,true);
  QXmlStreamWriterPrivate::write(this_00._M_head_impl,0x4ca05b,(void *)0x1,(size_t)__n);
  uVar1 = (pNVar3->prefix).m_size;
  if (uVar1 != 0) {
    __buf = (void *)0x8000000000000000;
    pQVar2 = (pNVar3->prefix).m_string;
    if (pQVar2 == (QString *)0x0) {
      __fd = 0;
      __n = (char16_t *)0x0;
    }
    else {
      __n = (pQVar2->d).ptr;
      if (__n == (char16_t *)0x0) {
        __n = L"";
      }
      __fd = (int)__n + (int)(pNVar3->prefix).m_pos * 2;
      __buf = (void *)(uVar1 | 0x8000000000000000);
    }
    QXmlStreamWriterPrivate::write(this_00._M_head_impl,__fd,__buf,(size_t)__n);
    QXmlStreamWriterPrivate::write(this_00._M_head_impl,0x4e7c0c,(void *)0x1,(size_t)__n);
  }
  QXmlStreamWriterPrivate::write
            (this_00._M_head_impl,name.field_0._0_4_,(void *)name.m_size,(size_t)__n);
  QXmlStreamWriterPrivate::write(this_00._M_head_impl,0x4dd42f,(void *)0x2,(size_t)__n);
  __n_00 = 1;
  QXmlStreamWriterPrivate::writeEscaped(this_00._M_head_impl,value,true);
  QXmlStreamWriterPrivate::write(this_00._M_head_impl,0x4dbb8f,(void *)0x1,__n_00);
  (this_00._M_head_impl)->field_0x79 = (this_00._M_head_impl)->field_0x79 | 2;
  return;
}

Assistant:

void QXmlStreamWriter::writeAttribute(QAnyStringView namespaceUri, QAnyStringView name, QAnyStringView value)
{
    Q_D(QXmlStreamWriter);
    Q_ASSERT(d->inStartElement);
    Q_ASSERT(!contains(name, ':'));
    QXmlStreamWriterPrivate::NamespaceDeclaration &namespaceDeclaration = d->findNamespace(namespaceUri, true, true);
    d->write(" ");
    if (!namespaceDeclaration.prefix.isEmpty()) {
        d->write(namespaceDeclaration.prefix);
        d->write(":");
    }
    d->write(name);
    d->write("=\"");
    d->writeEscaped(value, true);
    d->write("\"");
    d->didWriteAnyToken = true;
}